

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<8,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  RTCRayQueryContext *pRVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 (*pauVar14) [16];
  Geometry *pGVar15;
  undefined4 uVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  Geometry *pGVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  ulong unaff_R12;
  size_t mask;
  ulong uVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  undefined8 uVar48;
  uint uVar53;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar54;
  float fVar57;
  float fVar58;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar65;
  uint uVar66;
  undefined1 auVar64 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2624 [36];
  RTCFilterFunctionNArguments local_2600;
  undefined1 local_25d0 [16];
  Geometry *local_25b8;
  Scene *local_25b0;
  ulong local_25a8;
  float local_25a0;
  undefined4 local_259c;
  undefined4 local_2598;
  float local_2594;
  float local_2590;
  undefined4 local_258c;
  uint local_2588;
  uint local_2584;
  uint local_2580;
  undefined8 local_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2510 [16];
  float local_2500 [4];
  float local_24f0 [4];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [2] [16];
  undefined1 local_2490 [16];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      pauVar25 = (undefined1 (*) [16])local_2390;
      aVar1 = (ray->super_RayK<1>).dir.field_0;
      auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
      auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      local_2490._8_4_ = 0x7fffffff;
      local_2490._0_8_ = 0x7fffffff7fffffff;
      local_2490._12_4_ = 0x7fffffff;
      auVar52 = vandps_avx((undefined1  [16])aVar1,local_2490);
      auVar55._8_4_ = 0x219392ef;
      auVar55._0_8_ = 0x219392ef219392ef;
      auVar55._12_4_ = 0x219392ef;
      auVar52 = vcmpps_avx(auVar52,auVar55,1);
      auVar52 = vblendvps_avx((undefined1  [16])aVar1,auVar55,auVar52);
      auVar55 = vrcpps_avx(auVar52);
      auVar56._8_4_ = 0x3f800000;
      auVar56._0_8_ = &DAT_3f8000003f800000;
      auVar56._12_4_ = 0x3f800000;
      auVar52 = vfnmadd213ps_fma(auVar52,auVar55,auVar56);
      auVar12 = vfmadd132ps_fma(auVar52,auVar55,auVar55);
      fVar37 = auVar12._0_4_;
      local_23c0._4_4_ = fVar37;
      local_23c0._0_4_ = fVar37;
      local_23c0._8_4_ = fVar37;
      local_23c0._12_4_ = fVar37;
      local_23c0._16_4_ = fVar37;
      local_23c0._20_4_ = fVar37;
      local_23c0._24_4_ = fVar37;
      local_23c0._28_4_ = fVar37;
      auVar64 = ZEXT3264(local_23c0);
      auVar52 = vmovshdup_avx(auVar12);
      uVar48 = auVar52._0_8_;
      local_23e0._8_8_ = uVar48;
      local_23e0._0_8_ = uVar48;
      local_23e0._16_8_ = uVar48;
      local_23e0._24_8_ = uVar48;
      auVar68 = ZEXT3264(local_23e0);
      auVar56 = vshufpd_avx(auVar12,auVar12,1);
      auVar55 = vshufps_avx(auVar12,auVar12,0xaa);
      uVar48 = auVar55._0_8_;
      local_2400._8_8_ = uVar48;
      local_2400._0_8_ = uVar48;
      local_2400._16_8_ = uVar48;
      local_2400._24_8_ = uVar48;
      auVar74 = ZEXT3264(local_2400);
      auVar61._0_4_ = fVar37 * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar61._4_4_ = auVar12._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
      auVar61._8_4_ = auVar12._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
      auVar61._12_4_ = auVar12._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
      auVar55 = vmovshdup_avx(auVar61);
      auVar12 = vshufps_avx(auVar61,auVar61,0xaa);
      uVar16 = auVar8._0_4_;
      auVar32 = ZEXT3264(CONCAT428(uVar16,CONCAT424(uVar16,CONCAT420(uVar16,CONCAT416(uVar16,
                                                  CONCAT412(uVar16,CONCAT48(uVar16,CONCAT44(uVar16,
                                                  uVar16))))))));
      uVar24 = (ulong)((uint)(auVar52._0_4_ < 0.0) * 8 + 0x10);
      uVar26 = (ulong)((uint)(auVar56._0_4_ < 0.0) * 8 + 0x20);
      local_25a8 = uVar26 ^ 8;
      uVar19 = CONCAT44(auVar61._0_4_,auVar61._0_4_);
      local_2420._0_8_ = uVar19 ^ 0x8000000080000000;
      local_2420._8_4_ = -auVar61._0_4_;
      local_2420._12_4_ = -auVar61._0_4_;
      local_2420._16_4_ = -auVar61._0_4_;
      local_2420._20_4_ = -auVar61._0_4_;
      local_2420._24_4_ = -auVar61._0_4_;
      local_2420._28_4_ = -auVar61._0_4_;
      auVar76 = ZEXT3264(local_2420);
      uVar47 = auVar55._0_4_;
      uVar53 = auVar55._4_4_;
      local_2440._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
      local_2440._8_4_ = uVar47 ^ 0x80000000;
      local_2440._12_4_ = uVar53 ^ 0x80000000;
      local_2440._16_4_ = uVar47 ^ 0x80000000;
      local_2440._20_4_ = uVar53 ^ 0x80000000;
      local_2440._24_4_ = uVar47 ^ 0x80000000;
      local_2440._28_4_ = uVar53 ^ 0x80000000;
      auVar79 = ZEXT3264(local_2440);
      uVar47 = auVar12._0_4_;
      uVar53 = auVar12._4_4_;
      local_2460._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      local_2460._8_4_ = uVar47 ^ 0x80000000;
      local_2460._12_4_ = uVar53 ^ 0x80000000;
      local_2460._16_4_ = uVar47 ^ 0x80000000;
      local_2460._20_4_ = uVar53 ^ 0x80000000;
      local_2460._24_4_ = uVar47 ^ 0x80000000;
      local_2460._28_4_ = uVar53 ^ 0x80000000;
      auVar82 = ZEXT3264(local_2460);
      uVar16 = auVar7._0_4_;
      local_2480._4_4_ = uVar16;
      local_2480._0_4_ = uVar16;
      local_2480._8_4_ = uVar16;
      local_2480._12_4_ = uVar16;
      local_2480._16_4_ = uVar16;
      local_2480._20_4_ = uVar16;
      local_2480._24_4_ = uVar16;
      local_2480._28_4_ = uVar16;
      auVar84 = ZEXT3264(local_2480);
      local_2570 = mm_lookupmask_ps._240_8_;
      uStack_2568 = mm_lookupmask_ps._248_8_;
      do {
        do {
          do {
            if (pauVar25 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar14 = pauVar25 + -1;
            pauVar25 = pauVar25 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar14 + 8));
          uVar19 = *(ulong *)*pauVar25;
          do {
            if ((uVar19 & 8) == 0) {
              puVar17 = (ulong *)((uVar19 & 0xfffffffffffffff0) + 0x40);
              if ((uVar19 & 0xfffffffffffffff0) == 0) {
                puVar17 = (ulong *)0x0;
              }
              auVar52._8_8_ = 0;
              auVar52._0_8_ = *puVar17;
              auVar8 = vpmovzxbw_avx(auVar52);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = puVar17[1];
              auVar52 = vpmovzxbw_avx(auVar7);
              auVar52 = vpminuw_avx(auVar8,auVar52);
              auVar52 = vpcmpeqw_avx(auVar8,auVar52);
              auVar52 = vpacksswb_avx(auVar52,auVar52);
              uVar16 = (undefined4)puVar17[6];
              auVar40._4_4_ = uVar16;
              auVar40._0_4_ = uVar16;
              auVar40._8_4_ = uVar16;
              auVar40._12_4_ = uVar16;
              auVar40._16_4_ = uVar16;
              auVar40._20_4_ = uVar16;
              auVar40._24_4_ = uVar16;
              auVar40._28_4_ = uVar16;
              uVar16 = *(undefined4 *)((long)puVar17 + 0x3c);
              auVar44._4_4_ = uVar16;
              auVar44._0_4_ = uVar16;
              auVar44._8_4_ = uVar16;
              auVar44._12_4_ = uVar16;
              auVar44._16_4_ = uVar16;
              auVar44._20_4_ = uVar16;
              auVar44._24_4_ = uVar16;
              auVar44._28_4_ = uVar16;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = puVar17[fVar37 < 0.0];
              auVar10 = vpmovzxbd_avx2(auVar8);
              auVar10 = vcvtdq2ps_avx(auVar10);
              auVar7 = vfmadd213ps_fma(auVar10,auVar44,auVar40);
              auVar12._8_8_ = 0;
              auVar12._0_8_ = *(ulong *)((long)puVar17 + ((ulong)(fVar37 < 0.0) * 8 ^ 8));
              auVar10 = vpmovzxbd_avx2(auVar12);
              auVar10 = vcvtdq2ps_avx(auVar10);
              auVar8 = vfmadd213ps_fma(auVar10,auVar44,auVar40);
              uVar16 = *(undefined4 *)((long)puVar17 + 0x34);
              auVar41._4_4_ = uVar16;
              auVar41._0_4_ = uVar16;
              auVar41._8_4_ = uVar16;
              auVar41._12_4_ = uVar16;
              auVar41._16_4_ = uVar16;
              auVar41._20_4_ = uVar16;
              auVar41._24_4_ = uVar16;
              auVar41._28_4_ = uVar16;
              uVar16 = (undefined4)puVar17[8];
              auVar45._4_4_ = uVar16;
              auVar45._0_4_ = uVar16;
              auVar45._8_4_ = uVar16;
              auVar45._12_4_ = uVar16;
              auVar45._16_4_ = uVar16;
              auVar45._20_4_ = uVar16;
              auVar45._24_4_ = uVar16;
              auVar45._28_4_ = uVar16;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)((long)puVar17 + uVar24);
              auVar10 = vpmovzxbd_avx2(auVar2);
              auVar10 = vcvtdq2ps_avx(auVar10);
              auVar55 = vfmadd213ps_fma(auVar10,auVar45,auVar41);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)((long)puVar17 + (uVar24 ^ 8));
              auVar10 = vpmovzxbd_avx2(auVar3);
              auVar10 = vcvtdq2ps_avx(auVar10);
              auVar56 = vfmadd213ps_fma(auVar10,auVar45,auVar41);
              uVar16 = (undefined4)puVar17[7];
              auVar42._4_4_ = uVar16;
              auVar42._0_4_ = uVar16;
              auVar42._8_4_ = uVar16;
              auVar42._12_4_ = uVar16;
              auVar42._16_4_ = uVar16;
              auVar42._20_4_ = uVar16;
              auVar42._24_4_ = uVar16;
              auVar42._28_4_ = uVar16;
              uVar16 = *(undefined4 *)((long)puVar17 + 0x44);
              auVar46._4_4_ = uVar16;
              auVar46._0_4_ = uVar16;
              auVar46._8_4_ = uVar16;
              auVar46._12_4_ = uVar16;
              auVar46._16_4_ = uVar16;
              auVar46._20_4_ = uVar16;
              auVar46._24_4_ = uVar16;
              auVar46._28_4_ = uVar16;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)((long)puVar17 + uVar26);
              auVar10 = vpmovzxbd_avx2(auVar4);
              auVar10 = vcvtdq2ps_avx(auVar10);
              auVar12 = vfmadd213ps_fma(auVar10,auVar46,auVar42);
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)((long)puVar17 + local_25a8);
              auVar10 = vpmovzxbd_avx2(auVar5);
              auVar10 = vcvtdq2ps_avx(auVar10);
              auVar61 = vfmadd213ps_fma(auVar10,auVar46,auVar42);
              auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar64._0_32_,auVar76._0_32_);
              auVar55 = vfmadd213ps_fma(ZEXT1632(auVar55),auVar68._0_32_,auVar79._0_32_);
              auVar10 = vpmaxsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar55));
              auVar7 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar74._0_32_,auVar82._0_32_);
              auVar40 = vpmaxsd_avx2(ZEXT1632(auVar7),auVar84._0_32_);
              local_2560 = vpmaxsd_avx2(auVar10,auVar40);
              auVar7 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar64._0_32_,auVar76._0_32_);
              auVar8 = vfmadd213ps_fma(ZEXT1632(auVar56),auVar68._0_32_,auVar79._0_32_);
              auVar10 = vpminsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar8));
              auVar7 = vfmadd213ps_fma(ZEXT1632(auVar61),auVar74._0_32_,auVar82._0_32_);
              auVar40 = vpminsd_avx2(ZEXT1632(auVar7),auVar32._0_32_);
              auVar10 = vpminsd_avx2(auVar10,auVar40);
              auVar10 = vpcmpgtd_avx2(local_2560,auVar10);
              uVar16 = vmovmskps_avx(auVar10);
              unaff_R12 = (ulong)(byte)(~(byte)uVar16 &
                                       (SUB161(auVar52 >> 7,0) & 1 |
                                        (SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                                        (SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                                        (SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                                        (SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                                        (SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                                        (SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                                       SUB161(auVar52 >> 0x3f,0) << 7));
            }
            if ((uVar19 & 8) == 0) {
              if (unaff_R12 == 0) {
                pGVar15 = (Geometry *)0x4;
              }
              else {
                uVar18 = uVar19 & 0xfffffffffffffff0;
                lVar28 = 0;
                for (uVar19 = unaff_R12; (uVar19 & 1) == 0;
                    uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                  lVar28 = lVar28 + 1;
                }
                pGVar15 = (Geometry *)0x0;
                uVar21 = unaff_R12 - 1 & unaff_R12;
                uVar19 = *(ulong *)(uVar18 + lVar28 * 8);
                if (uVar21 != 0) {
                  uVar47 = *(uint *)(local_2560 + lVar28 * 4);
                  lVar28 = 0;
                  for (uVar11 = uVar21; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000
                      ) {
                    lVar28 = lVar28 + 1;
                  }
                  uVar21 = uVar21 - 1 & uVar21;
                  uVar11 = *(ulong *)(uVar18 + lVar28 * 8);
                  uVar53 = *(uint *)(local_2560 + lVar28 * 4);
                  if (uVar21 == 0) {
                    if (uVar47 < uVar53) {
                      *(ulong *)*pauVar25 = uVar11;
                      *(uint *)(*pauVar25 + 8) = uVar53;
                      pauVar25 = pauVar25 + 1;
                    }
                    else {
                      *(ulong *)*pauVar25 = uVar19;
                      *(uint *)(*pauVar25 + 8) = uVar47;
                      uVar19 = uVar11;
                      pauVar25 = pauVar25 + 1;
                    }
                  }
                  else {
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = uVar19;
                    auVar52 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar47));
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = uVar11;
                    auVar7 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar53));
                    lVar28 = 0;
                    for (uVar19 = uVar21; (uVar19 & 1) == 0;
                        uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                      lVar28 = lVar28 + 1;
                    }
                    uVar21 = uVar21 - 1 & uVar21;
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = *(ulong *)(uVar18 + lVar28 * 8);
                    auVar8 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_2560 + lVar28 * 4)));
                    if (uVar21 == 0) {
                      auVar55 = vpcmpgtd_avx(auVar7,auVar52);
                      auVar56 = vpshufd_avx(auVar55,0xaa);
                      auVar55 = vblendvps_avx(auVar7,auVar52,auVar56);
                      auVar52 = vblendvps_avx(auVar52,auVar7,auVar56);
                      auVar7 = vpcmpgtd_avx(auVar8,auVar55);
                      auVar56 = vpshufd_avx(auVar7,0xaa);
                      auVar7 = vblendvps_avx(auVar8,auVar55,auVar56);
                      auVar8 = vblendvps_avx(auVar55,auVar8,auVar56);
                      auVar55 = vpcmpgtd_avx(auVar8,auVar52);
                      auVar56 = vpshufd_avx(auVar55,0xaa);
                      auVar55 = vblendvps_avx(auVar8,auVar52,auVar56);
                      auVar52 = vblendvps_avx(auVar52,auVar8,auVar56);
                      *pauVar25 = auVar52;
                      pauVar25[1] = auVar55;
                      uVar19 = auVar7._0_8_;
                      pauVar25 = pauVar25 + 2;
                    }
                    else {
                      lVar28 = 0;
                      for (uVar19 = uVar21; (uVar19 & 1) == 0;
                          uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                        lVar28 = lVar28 + 1;
                      }
                      uVar21 = uVar21 - 1 & uVar21;
                      auVar49._8_8_ = 0;
                      auVar49._0_8_ = *(ulong *)(uVar18 + lVar28 * 8);
                      auVar55 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_2560 + lVar28 * 4)))
                      ;
                      if (uVar21 == 0) {
                        auVar56 = vpcmpgtd_avx(auVar7,auVar52);
                        auVar12 = vpshufd_avx(auVar56,0xaa);
                        auVar56 = vblendvps_avx(auVar7,auVar52,auVar12);
                        auVar52 = vblendvps_avx(auVar52,auVar7,auVar12);
                        auVar7 = vpcmpgtd_avx(auVar55,auVar8);
                        auVar12 = vpshufd_avx(auVar7,0xaa);
                        auVar7 = vblendvps_avx(auVar55,auVar8,auVar12);
                        auVar8 = vblendvps_avx(auVar8,auVar55,auVar12);
                        auVar55 = vpcmpgtd_avx(auVar8,auVar52);
                        auVar12 = vpshufd_avx(auVar55,0xaa);
                        auVar55 = vblendvps_avx(auVar8,auVar52,auVar12);
                        auVar52 = vblendvps_avx(auVar52,auVar8,auVar12);
                        auVar8 = vpcmpgtd_avx(auVar7,auVar56);
                        auVar12 = vpshufd_avx(auVar8,0xaa);
                        auVar8 = vblendvps_avx(auVar7,auVar56,auVar12);
                        auVar7 = vblendvps_avx(auVar56,auVar7,auVar12);
                        auVar56 = vpcmpgtd_avx(auVar55,auVar7);
                        auVar12 = vpshufd_avx(auVar56,0xaa);
                        auVar56 = vblendvps_avx(auVar55,auVar7,auVar12);
                        auVar7 = vblendvps_avx(auVar7,auVar55,auVar12);
                        *pauVar25 = auVar52;
                        pauVar25[1] = auVar7;
                        pauVar25[2] = auVar56;
                        uVar19 = auVar8._0_8_;
                        pauVar25 = pauVar25 + 3;
                      }
                      else {
                        *pauVar25 = auVar52;
                        pauVar25[1] = auVar7;
                        pauVar25[2] = auVar8;
                        pauVar25[3] = auVar55;
                        lVar28 = 0x30;
                        do {
                          lVar27 = lVar28;
                          lVar28 = 0;
                          for (uVar19 = uVar21; (uVar19 & 1) == 0;
                              uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                            lVar28 = lVar28 + 1;
                          }
                          auVar34._8_8_ = 0;
                          auVar34._0_8_ = *(ulong *)(uVar18 + lVar28 * 8);
                          auVar52 = vpunpcklqdq_avx(auVar34,ZEXT416(*(uint *)(local_2560 +
                                                                             lVar28 * 4)));
                          *(undefined1 (*) [16])(pauVar25[1] + lVar27) = auVar52;
                          uVar21 = uVar21 - 1 & uVar21;
                          lVar28 = lVar27 + 0x10;
                        } while (uVar21 != 0);
                        pauVar14 = (undefined1 (*) [16])(pauVar25[1] + lVar27);
                        if (lVar27 + 0x10 != 0) {
                          lVar28 = 0x10;
                          pauVar20 = pauVar25;
                          do {
                            auVar52 = pauVar20[1];
                            uVar47 = *(uint *)(pauVar20[1] + 8);
                            pauVar20 = pauVar20 + 1;
                            lVar27 = lVar28;
                            do {
                              if (uVar47 <= *(uint *)(pauVar25[-1] + lVar27 + 8)) {
                                pauVar22 = (undefined1 (*) [16])(*pauVar25 + lVar27);
                                break;
                              }
                              *(undefined1 (*) [16])(*pauVar25 + lVar27) =
                                   *(undefined1 (*) [16])(pauVar25[-1] + lVar27);
                              lVar27 = lVar27 + -0x10;
                              pauVar22 = pauVar25;
                            } while (lVar27 != 0);
                            *pauVar22 = auVar52;
                            lVar28 = lVar28 + 0x10;
                          } while (pauVar14 != pauVar20);
                        }
                        uVar19 = *(ulong *)*pauVar14;
                        pauVar25 = pauVar14;
                      }
                    }
                  }
                }
              }
            }
            else {
              pGVar15 = (Geometry *)0x6;
            }
          } while ((int)pGVar15 == 0);
        } while ((int)pGVar15 != 6);
        uVar18 = (ulong)((uint)uVar19 & 0xf);
        if (uVar18 != 8) {
          uVar19 = uVar19 & 0xfffffffffffffff0;
          lVar28 = 0;
          do {
            lVar27 = lVar28 * 0xb0;
            auVar52 = *(undefined1 (*) [16])(uVar19 + 0x80 + lVar27);
            auVar7 = *(undefined1 (*) [16])(uVar19 + 0x40 + lVar27);
            auVar8 = *(undefined1 (*) [16])(uVar19 + 0x70 + lVar27);
            auVar55 = *(undefined1 (*) [16])(uVar19 + 0x50 + lVar27);
            auVar29._0_4_ = auVar52._0_4_ * auVar7._0_4_;
            auVar29._4_4_ = auVar52._4_4_ * auVar7._4_4_;
            auVar29._8_4_ = auVar52._8_4_ * auVar7._8_4_;
            auVar29._12_4_ = auVar52._12_4_ * auVar7._12_4_;
            local_24d0 = vfmsub231ps_fma(auVar29,auVar8,auVar55);
            auVar56 = *(undefined1 (*) [16])(uVar19 + 0x60 + lVar27);
            auVar12 = *(undefined1 (*) [16])(uVar19 + 0x30 + lVar27);
            auVar35._0_4_ = auVar55._0_4_ * auVar56._0_4_;
            auVar35._4_4_ = auVar55._4_4_ * auVar56._4_4_;
            auVar35._8_4_ = auVar55._8_4_ * auVar56._8_4_;
            auVar35._12_4_ = auVar55._12_4_ * auVar56._12_4_;
            local_24c0 = vfmsub231ps_fma(auVar35,auVar52,auVar12);
            uVar16 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar69._4_4_ = uVar16;
            auVar69._0_4_ = uVar16;
            auVar69._8_4_ = uVar16;
            auVar69._12_4_ = uVar16;
            auVar61 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + lVar27),auVar69);
            uVar16 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar70._4_4_ = uVar16;
            auVar70._0_4_ = uVar16;
            auVar70._8_4_ = uVar16;
            auVar70._12_4_ = uVar16;
            auVar2 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x10 + lVar27),auVar70);
            uVar16 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar71._4_4_ = uVar16;
            auVar71._0_4_ = uVar16;
            auVar71._8_4_ = uVar16;
            auVar71._12_4_ = uVar16;
            auVar3 = vsubps_avx(*(undefined1 (*) [16])(uVar19 + 0x20 + lVar27),auVar71);
            fVar54 = (ray->super_RayK<1>).dir.field_0.m128[0];
            auVar72._4_4_ = fVar54;
            auVar72._0_4_ = fVar54;
            auVar72._8_4_ = fVar54;
            auVar72._12_4_ = fVar54;
            fVar57 = (ray->super_RayK<1>).dir.field_0.m128[1];
            auVar75._4_4_ = fVar57;
            auVar75._0_4_ = fVar57;
            auVar75._8_4_ = fVar57;
            auVar75._12_4_ = fVar57;
            fVar58 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar77._4_4_ = fVar58;
            auVar77._0_4_ = fVar58;
            auVar77._8_4_ = fVar58;
            auVar77._12_4_ = fVar58;
            auVar80._0_4_ = fVar54 * auVar2._0_4_;
            auVar80._4_4_ = fVar54 * auVar2._4_4_;
            auVar80._8_4_ = fVar54 * auVar2._8_4_;
            auVar80._12_4_ = fVar54 * auVar2._12_4_;
            auVar4 = vfmsub231ps_fma(auVar80,auVar61,auVar75);
            auVar67._0_4_ = auVar52._0_4_ * auVar4._0_4_;
            auVar67._4_4_ = auVar52._4_4_ * auVar4._4_4_;
            auVar67._8_4_ = auVar52._8_4_ * auVar4._8_4_;
            auVar67._12_4_ = auVar52._12_4_ * auVar4._12_4_;
            auVar81._0_4_ = auVar55._0_4_ * auVar4._0_4_;
            auVar81._4_4_ = auVar55._4_4_ * auVar4._4_4_;
            auVar81._8_4_ = auVar55._8_4_ * auVar4._8_4_;
            auVar81._12_4_ = auVar55._12_4_ * auVar4._12_4_;
            auVar63._0_4_ = fVar58 * auVar61._0_4_;
            auVar63._4_4_ = fVar58 * auVar61._4_4_;
            auVar63._8_4_ = fVar58 * auVar61._8_4_;
            auVar63._12_4_ = fVar58 * auVar61._12_4_;
            auVar55 = vfmsub231ps_fma(auVar63,auVar3,auVar72);
            auVar52 = vfmadd231ps_fma(auVar67,auVar55,auVar8);
            auVar55 = vfmadd231ps_fma(auVar81,auVar7,auVar55);
            auVar62._0_4_ = auVar8._0_4_ * auVar12._0_4_;
            auVar62._4_4_ = auVar8._4_4_ * auVar12._4_4_;
            auVar62._8_4_ = auVar8._8_4_ * auVar12._8_4_;
            auVar62._12_4_ = auVar8._12_4_ * auVar12._12_4_;
            local_24b0[0] = vfmsub231ps_fma(auVar62,auVar56,auVar7);
            auVar83._0_4_ = fVar57 * auVar3._0_4_;
            auVar83._4_4_ = fVar57 * auVar3._4_4_;
            auVar83._8_4_ = fVar57 * auVar3._8_4_;
            auVar83._12_4_ = fVar57 * auVar3._12_4_;
            auVar4 = vfmsub231ps_fma(auVar83,auVar2,auVar77);
            auVar78._0_4_ = local_24b0[0]._0_4_ * fVar58;
            auVar78._4_4_ = local_24b0[0]._4_4_ * fVar58;
            auVar78._8_4_ = local_24b0[0]._8_4_ * fVar58;
            auVar78._12_4_ = local_24b0[0]._12_4_ * fVar58;
            auVar7 = vfmadd231ps_fma(auVar78,local_24c0,auVar75);
            auVar8 = vfmadd231ps_fma(auVar7,local_24d0,auVar72);
            auVar7 = vfmadd231ps_fma(auVar52,auVar4,auVar56);
            auVar60._8_8_ = 0x8000000080000000;
            auVar60._0_8_ = 0x8000000080000000;
            auVar52 = vandps_avx(auVar8,auVar60);
            uVar47 = auVar52._0_4_;
            local_2560._0_4_ = (float)(uVar47 ^ auVar7._0_4_);
            uVar53 = auVar52._4_4_;
            local_2560._4_4_ = (float)(uVar53 ^ auVar7._4_4_);
            uVar65 = auVar52._8_4_;
            local_2560._8_4_ = (float)(uVar65 ^ auVar7._8_4_);
            uVar66 = auVar52._12_4_;
            local_2560._12_4_ = (float)(uVar66 ^ auVar7._12_4_);
            auVar52 = vfmadd231ps_fma(auVar55,auVar12,auVar4);
            local_2560._16_4_ = (float)(uVar47 ^ auVar52._0_4_);
            local_2560._20_4_ = (float)(uVar53 ^ auVar52._4_4_);
            local_2560._24_4_ = (float)(uVar65 ^ auVar52._8_4_);
            local_2560._28_4_ = (float)(uVar66 ^ auVar52._12_4_);
            auVar55 = ZEXT416(0) << 0x20;
            auVar52 = vcmpps_avx(local_2560._0_16_,auVar55,5);
            auVar7 = vcmpps_avx(local_2560._16_16_,auVar55,5);
            auVar52 = vandps_avx(auVar7,auVar52);
            local_2530 = vandps_avx(auVar8,local_2490);
            auVar7 = vcmpps_avx(auVar8,auVar55,4);
            auVar52 = vandps_avx(auVar52,auVar7);
            auVar73._0_4_ = local_2560._0_4_ + local_2560._16_4_;
            auVar73._4_4_ = local_2560._4_4_ + local_2560._20_4_;
            auVar73._8_4_ = local_2560._8_4_ + local_2560._24_4_;
            auVar73._12_4_ = local_2560._12_4_ + local_2560._28_4_;
            auVar7 = vcmpps_avx(auVar73,local_2530,2);
            auVar52 = vandps_avx(auVar52,auVar7);
            auVar9._8_8_ = uStack_2568;
            auVar9._0_8_ = local_2570;
            auVar9 = auVar9 & auVar52;
            if ((((auVar9 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar9 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar9[0xf] < '\0') {
              auVar13._8_8_ = uStack_2568;
              auVar13._0_8_ = local_2570;
              auVar52 = vandps_avx(auVar52,auVar13);
              auVar50._0_4_ = local_24b0[0]._0_4_ * auVar3._0_4_;
              auVar50._4_4_ = local_24b0[0]._4_4_ * auVar3._4_4_;
              auVar50._8_4_ = local_24b0[0]._8_4_ * auVar3._8_4_;
              auVar50._12_4_ = local_24b0[0]._12_4_ * auVar3._12_4_;
              auVar7 = vfmadd213ps_fma(auVar2,local_24c0,auVar50);
              auVar7 = vfmadd213ps_fma(auVar61,local_24d0,auVar7);
              local_2540._0_4_ = (float)(uVar47 ^ auVar7._0_4_);
              local_2540._4_4_ = (float)(uVar53 ^ auVar7._4_4_);
              local_2540._8_4_ = (float)(uVar65 ^ auVar7._8_4_);
              local_2540._12_4_ = (float)(uVar66 ^ auVar7._12_4_);
              fVar54 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar39._0_4_ = local_2530._0_4_ * fVar54;
              auVar39._4_4_ = local_2530._4_4_ * fVar54;
              auVar39._8_4_ = local_2530._8_4_ * fVar54;
              auVar39._12_4_ = local_2530._12_4_ * fVar54;
              auVar7 = vcmpps_avx(auVar39,local_2540,1);
              fVar54 = (ray->super_RayK<1>).tfar;
              auVar51._0_4_ = local_2530._0_4_ * fVar54;
              auVar51._4_4_ = local_2530._4_4_ * fVar54;
              auVar51._8_4_ = local_2530._8_4_ * fVar54;
              auVar51._12_4_ = local_2530._12_4_ * fVar54;
              auVar8 = vcmpps_avx(local_2540,auVar51,2);
              auVar7 = vandps_avx(auVar8,auVar7);
              auVar8 = auVar52 & auVar7;
              if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar8[0xf] < '\0') {
                auVar52 = vandps_avx(auVar52,auVar7);
                local_2510 = auVar52;
                auVar7 = vrcpps_avx(local_2530);
                auVar36._8_4_ = 0x3f800000;
                auVar36._0_8_ = &DAT_3f8000003f800000;
                auVar36._12_4_ = 0x3f800000;
                auVar8 = vfnmadd213ps_fma(local_2530,auVar7,auVar36);
                auVar7 = vfmadd132ps_fma(auVar8,auVar7,auVar7);
                fVar54 = auVar7._0_4_;
                local_24e0._0_4_ = fVar54 * local_2540._0_4_;
                fVar57 = auVar7._4_4_;
                local_24e0._4_4_ = fVar57 * local_2540._4_4_;
                fVar58 = auVar7._8_4_;
                local_24e0._8_4_ = fVar58 * local_2540._8_4_;
                fVar59 = auVar7._12_4_;
                local_24e0._12_4_ = fVar59 * local_2540._12_4_;
                local_2624._4_16_ = auVar52;
                local_2500[0] = fVar54 * local_2560._0_4_;
                local_2500[1] = fVar57 * local_2560._4_4_;
                local_2500[2] = fVar58 * local_2560._8_4_;
                local_2500[3] = fVar59 * local_2560._12_4_;
                local_24f0[0] = fVar54 * local_2560._16_4_;
                local_24f0[1] = fVar57 * local_2560._20_4_;
                local_24f0[2] = fVar58 * local_2560._24_4_;
                local_24f0[3] = fVar59 * local_2560._28_4_;
                auVar30._8_4_ = 0x7f800000;
                auVar30._0_8_ = 0x7f8000007f800000;
                auVar30._12_4_ = 0x7f800000;
                auVar7 = vblendvps_avx(auVar30,local_24e0,auVar52);
                auVar8 = vshufps_avx(auVar7,auVar7,0xb1);
                auVar8 = vminps_avx(auVar8,auVar7);
                auVar55 = vshufpd_avx(auVar8,auVar8,1);
                auVar8 = vminps_avx(auVar55,auVar8);
                auVar7 = vcmpps_avx(auVar7,auVar8,0);
                auVar8 = auVar52 & auVar7;
                if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar8[0xf] < '\0') {
                  auVar52 = vandps_avx(auVar7,auVar52);
                }
                lVar27 = lVar27 + uVar19;
                uVar16 = vmovmskps_avx(auVar52);
                pGVar23 = (Geometry *)0x0;
                for (uVar21 = CONCAT44((int)((ulong)pGVar15 >> 0x20),uVar16); (uVar21 & 1) == 0;
                    uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                  pGVar23 = (Geometry *)((long)&(pGVar23->super_RefCount)._vptr_RefCount + 1);
                }
                local_25b0 = context->scene;
                auVar52 = local_24e0;
                do {
                  uVar47 = *(uint *)(lVar27 + 0x90 + (long)pGVar23 * 4);
                  pGVar15 = (local_25b0->geometries).items[uVar47].ptr;
                  if ((pGVar15->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_2624 + (long)pGVar23 * 4 + 4) = 0;
                    local_25d0 = auVar52;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar54 = local_2500[(long)pGVar23];
                      fVar57 = local_24f0[(long)pGVar23];
                      (ray->super_RayK<1>).tfar = *(float *)(local_24e0 + (long)pGVar23 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_24d0 + (long)pGVar23 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_24c0 + (long)pGVar23 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_24b0[0] + (long)pGVar23 * 4);
                      ray->u = fVar54;
                      ray->v = fVar57;
                      ray->primID = *(uint *)(lVar27 + 0xa0 + (long)pGVar23 * 4);
                      ray->geomID = uVar47;
                      pRVar6 = context->user;
                      ray->instID[0] = pRVar6->instID[0];
                      pGVar15 = (Geometry *)0x0;
                      ray->instPrimID[0] = pRVar6->instPrimID[0];
                      break;
                    }
                    local_2624._28_8_ = context->args;
                    local_25d0 = auVar52;
                    local_2600.context = context->user;
                    local_25a0 = *(float *)(local_24d0 + (long)pGVar23 * 4);
                    local_259c = *(undefined4 *)(local_24c0 + (long)pGVar23 * 4);
                    local_2598 = *(undefined4 *)(local_24b0[0] + (long)pGVar23 * 4);
                    local_2594 = local_2500[(long)pGVar23];
                    local_2590 = local_24f0[(long)pGVar23];
                    local_258c = *(undefined4 *)(lVar27 + 0xa0 + (long)pGVar23 * 4);
                    local_2588 = uVar47;
                    local_2584 = (local_2600.context)->instID[0];
                    local_2580 = (local_2600.context)->instPrimID[0];
                    fVar54 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_24e0 + (long)pGVar23 * 4);
                    local_2624._0_4_ = 0xffffffff;
                    local_2600.valid = (int *)local_2624;
                    local_2600.geometryUserPtr = pGVar15->userPtr;
                    local_2600.ray = (RTCRayN *)ray;
                    local_2600.hit = (RTCHitN *)&local_25a0;
                    local_2600.N = 1;
                    local_25b8 = pGVar15;
                    if ((pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar15->intersectionFilterN)(&local_2600),
                       *(int *)&((RefCount *)local_2600.valid)->_vptr_RefCount != 0)) {
                      if (*(RTCFilterFunctionN *)(local_2624._28_8_ + 0x10) !=
                          (RTCFilterFunctionN)0x0) {
                        if (((*(RTCRayQueryFlags *)local_2624._28_8_ &
                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_25b8->field_8).field_0x2 & 0x40) != 0)) {
                          (**(RTCFilterFunctionN *)(local_2624._28_8_ + 0x10))(&local_2600);
                        }
                        if (*(int *)&((RefCount *)local_2600.valid)->_vptr_RefCount == 0)
                        goto LAB_01a6da21;
                      }
                      (((Vec3f *)((long)local_2600.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2600.hit;
                      (((Vec3f *)((long)local_2600.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2600.hit + 4);
                      (((Vec3f *)((long)local_2600.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2600.hit + 8);
                      *(float *)((long)local_2600.ray + 0x3c) = *(float *)(local_2600.hit + 0xc);
                      *(float *)((long)local_2600.ray + 0x40) = *(float *)(local_2600.hit + 0x10);
                      *(float *)((long)local_2600.ray + 0x44) = *(float *)(local_2600.hit + 0x14);
                      *(float *)((long)local_2600.ray + 0x48) = *(float *)(local_2600.hit + 0x18);
                      *(float *)((long)local_2600.ray + 0x4c) = *(float *)(local_2600.hit + 0x1c);
                      *(float *)((long)local_2600.ray + 0x50) = *(float *)(local_2600.hit + 0x20);
                    }
                    else {
LAB_01a6da21:
                      (ray->super_RayK<1>).tfar = fVar54;
                    }
                    *(undefined4 *)(local_2624 + (long)pGVar23 * 4 + 4) = 0;
                    fVar54 = (ray->super_RayK<1>).tfar;
                    auVar31._4_4_ = fVar54;
                    auVar31._0_4_ = fVar54;
                    auVar31._8_4_ = fVar54;
                    auVar31._12_4_ = fVar54;
                    auVar52 = vcmpps_avx(local_25d0,auVar31,2);
                    local_2624._4_16_ = vandps_avx(auVar52,local_2624._4_16_);
                    pGVar15 = pGVar23;
                  }
                  if ((((local_2624._4_16_ >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                       && (local_2624._4_16_ >> 0x3f & (undefined1  [16])0x1) ==
                          (undefined1  [16])0x0) &&
                      (local_2624._4_16_ >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                      && -1 < local_2624[0x13]) break;
                  BVHNIntersector1<8,1048576,false,embree::avx2::ArrayIntersector1<embree::avx2::TriangleMIntersector1Moeller<4,true>>>
                  ::intersect(&local_2600);
                  pGVar23 = (Geometry *)local_2600.valid;
                  auVar52 = local_25d0;
                } while( true );
              }
            }
            lVar28 = lVar28 + 1;
          } while (lVar28 != uVar18 - 8);
        }
        fVar54 = (ray->super_RayK<1>).tfar;
        auVar32 = ZEXT3264(CONCAT428(fVar54,CONCAT424(fVar54,CONCAT420(fVar54,CONCAT416(fVar54,
                                                  CONCAT412(fVar54,CONCAT48(fVar54,CONCAT44(fVar54,
                                                  fVar54))))))));
        auVar64 = ZEXT3264(local_23c0);
        auVar68 = ZEXT3264(local_23e0);
        auVar74 = ZEXT3264(local_2400);
        auVar76 = ZEXT3264(local_2420);
        auVar79 = ZEXT3264(local_2440);
        auVar82 = ZEXT3264(local_2460);
        auVar84 = ZEXT3264(local_2480);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }